

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall
QMdiAreaPrivate::resetActiveWindow(QMdiAreaPrivate *this,QMdiSubWindow *deactivatedWindow)

{
  QWidget *this_00;
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  QWidget *this_01;
  
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  if (deactivatedWindow == (QMdiSubWindow *)0x0) {
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->aboutToBecomeActive);
    if (!bVar2) {
      QWeakPointer<QObject>::assign<QObject>(&(this->active).wp,(QObject *)0x0);
      goto LAB_0040b9f7;
    }
  }
  else {
    pDVar1 = (this->active).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this->active).wp.value;
    }
    if (pQVar3 == (QObject *)deactivatedWindow) {
      QWeakPointer<QObject>::assign<QObject>(&(this->active).wp,(QObject *)0x0);
      bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->aboutToBecomeActive);
      if ((((bVar2) || (this->isActivated != false)) ||
          (bVar2 = lastWindowAboutToBeDestroyed(this), bVar2)) &&
         (*(char *)(*(long *)&(deactivatedWindow->super_QWidget).field_0x8 + 0x2dc) == '\0')) {
        this_01 = QWidget::window(this_00);
        bVar2 = QWidget::isMinimized(this_01);
        if (!bVar2) {
          return;
        }
      }
LAB_0040b9f7:
      QMdiArea::subWindowActivated((QMdiArea *)this_00,(QMdiSubWindow *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void QMdiAreaPrivate::resetActiveWindow(QMdiSubWindow *deactivatedWindow)
{
    Q_Q(QMdiArea);
    if (deactivatedWindow) {
        if (deactivatedWindow != active)
            return;
        active = nullptr;
        if ((aboutToBecomeActive || isActivated || lastWindowAboutToBeDestroyed())
            && !isExplicitlyDeactivated(deactivatedWindow) && !q->window()->isMinimized()) {
            return;
        }
        emit q->subWindowActivated(nullptr);
        return;
    }

    if (aboutToBecomeActive)
        return;

    active = nullptr;
    emit q->subWindowActivated(nullptr);
}